

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetReservoirQuantileListAggregateFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  NotImplementedException *pNVar2;
  LogicalType *in_RDX;
  string local_40;
  
  switch(type->id_) {
  case TINYINT:
    GetTypedReservoirQuantileListAggregateFunction<signed_char,signed_char>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INTEGER:
switchD_00df6d0b_caseD_d:
    GetTypedReservoirQuantileListAggregateFunction<int,int>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case BIGINT:
switchD_00df6d0b_caseD_e:
    GetTypedReservoirQuantileListAggregateFunction<long,long>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
switchD_00df6d0b_caseD_f:
    pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented reservoir quantile list aggregate","");
    NotImplementedException::NotImplementedException(pNVar2,&local_40);
    __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    PVar1 = type->physical_type_;
    if (UINT64 < PVar1) {
      if (PVar1 != INT64) {
        if (PVar1 != INT128) goto LAB_00df6de5;
        goto LAB_00df6dc5;
      }
      goto switchD_00df6d0b_caseD_e;
    }
    if (PVar1 != INT16) {
      if (PVar1 != INT32) {
LAB_00df6de5:
        pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented reservoir quantile list aggregate","");
        NotImplementedException::NotImplementedException(pNVar2,&local_40);
        __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_00df6d0b_caseD_d;
    }
  case SMALLINT:
    GetTypedReservoirQuantileListAggregateFunction<short,short>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case FLOAT:
    GetTypedReservoirQuantileListAggregateFunction<float,float>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DOUBLE:
    GetTypedReservoirQuantileListAggregateFunction<double,double>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (type->id_ != HUGEINT) goto switchD_00df6d0b_caseD_f;
LAB_00df6dc5:
    GetTypedReservoirQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetReservoirQuantileListAggregateFunction(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
		return GetTypedReservoirQuantileListAggregateFunction<int8_t, int8_t>(type);
	case LogicalTypeId::SMALLINT:
		return GetTypedReservoirQuantileListAggregateFunction<int16_t, int16_t>(type);
	case LogicalTypeId::INTEGER:
		return GetTypedReservoirQuantileListAggregateFunction<int32_t, int32_t>(type);
	case LogicalTypeId::BIGINT:
		return GetTypedReservoirQuantileListAggregateFunction<int64_t, int64_t>(type);
	case LogicalTypeId::HUGEINT:
		return GetTypedReservoirQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
	case LogicalTypeId::FLOAT:
		return GetTypedReservoirQuantileListAggregateFunction<float, float>(type);
	case LogicalTypeId::DOUBLE:
		return GetTypedReservoirQuantileListAggregateFunction<double, double>(type);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return GetTypedReservoirQuantileListAggregateFunction<int16_t, int16_t>(type);
		case PhysicalType::INT32:
			return GetTypedReservoirQuantileListAggregateFunction<int32_t, int32_t>(type);
		case PhysicalType::INT64:
			return GetTypedReservoirQuantileListAggregateFunction<int64_t, int64_t>(type);
		case PhysicalType::INT128:
			return GetTypedReservoirQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
		default:
			throw NotImplementedException("Unimplemented reservoir quantile list aggregate");
		}
	default:
		// TODO: Add quantitative temporal types
		throw NotImplementedException("Unimplemented reservoir quantile list aggregate");
	}
}